

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

ssize_t __thiscall Hpipe::Lexer::read(Lexer *this,int __fd,void *__buf,size_t __nbytes)

{
  Type TVar1;
  Lexem *pLVar2;
  Lexem *this_00;
  ErrorList *this_01;
  bool bVar3;
  int i;
  int iVar4;
  long lVar5;
  int num_grp;
  uint uVar6;
  Lexem *pLVar7;
  Lexem **ppLVar8;
  undefined4 in_register_00000034;
  Source *source;
  char *cur;
  Lexem **ppLVar9;
  allocator local_a1;
  Lexem *local_a0;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [2];
  
  source = (Source *)CONCAT44(in_register_00000034,__fd);
  pLVar2 = &this->first_item;
  do {
    pLVar7 = pLVar2;
    pLVar2 = pLVar7->next;
  } while (pLVar7->next != (Lexem *)0x0);
  this->last = pLVar7;
  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
    this->sibling[lVar5] = (Lexem *)0x0;
  }
  cur = source->data;
  local_a0 = pLVar7;
  if (cur == (char *)0x0) {
    this_01 = this->error_list;
    std::__cxx11::string::string((string *)&local_98,source->provenance,&local_a1);
    std::operator+(local_78,"Impossible to open ",&local_98);
    ErrorList::add(this_01,source,(char *)0x0,local_78[0]._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::~string((string *)&local_98);
  }
  else {
    do {
      iVar4 = read_tok(this,source,cur);
      cur = cur + iVar4;
    } while (iVar4 != 0);
    local_78[0]._M_dataplus._M_p = (pointer)0x1;
    local_78[0]._M_string_length = 0x100000003;
    local_78[0].field_2._M_allocated_capacity = 0x300000003;
    local_78[0].field_2._8_8_ = 0x100000002;
    for (uVar6 = 0xf; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
      ppLVar9 = this->sibling + uVar6;
      while (pLVar2 = *ppLVar9, pLVar2 != (Lexem *)0x0) {
        iVar4 = *(int *)((long)&local_78[0]._M_dataplus._M_p + (ulong)uVar6 * 4);
        if (iVar4 == 3) {
          assemble_barg(this,pLVar2,1,1);
        }
        else if (iVar4 == 2) {
          assemble_rarg(this,pLVar2);
        }
        else if (iVar4 == 1) {
          assemble_larg(this,pLVar2);
        }
        ppLVar9 = &pLVar2->sibling;
      }
    }
    pLVar2 = local_a0;
    while (pLVar7 = pLVar2, pLVar7 != (Lexem *)0x0) {
      std::__cxx11::string::string((string *)&local_98,"=",&local_a1);
      bVar3 = Lexem::eq(pLVar7,OPERATOR,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      ppLVar9 = &pLVar7->next;
      ppLVar8 = ppLVar9;
      if (bVar3) {
        while (this_00 = *ppLVar8, this_00 != (Lexem *)0x0) {
          std::__cxx11::string::string((string *)&local_98,"=",&local_a1);
          bVar3 = Lexem::eq(this_00,OPERATOR,&local_98);
          if (bVar3) {
            std::__cxx11::string::~string((string *)&local_98);
            break;
          }
          TVar1 = this_00->type;
          std::__cxx11::string::~string((string *)&local_98);
          if ((TVar1 - TRAINING & 0xfffffffa) == 0) break;
          ppLVar8 = &this_00->next;
        }
        pLVar2 = *ppLVar9;
        if (this_00 != pLVar2) {
          pLVar7->children[1] = pLVar2;
          pLVar2->prev = (Lexem *)0x0;
          pLVar2->parent = pLVar7;
          if (this_00 != (Lexem *)0x0) {
            this_00->prev->next = (Lexem *)0x0;
            this_00->prev = pLVar7;
          }
          *ppLVar9 = this_00;
          pLVar2 = this_00;
        }
      }
      else {
        pLVar2 = *ppLVar9;
      }
    }
    pLVar7 = local_a0->next;
  }
  return (ssize_t)pLVar7;
}

Assistant:

Lexem *Lexer::read( Source *source ) {
    // init
    last = &first_item;
    while ( last->next )
        last = last->next;
    Lexem *res = last;

    for( int i = 0; i < max_op_grp; ++i )
        sibling[ i ] = 0;

    // tokenize
    const char *data = source->data;
    if ( not data ) {
        error_list.add( source, 0, ( "Impossible to open " + std::string( source->provenance ) ).c_str() );
        return res;
    }

    while ( int inc = read_tok( source, data ) )
        data += inc;

    // operators
    enum { need_none = 0, need_larg = 1, need_rarg = 2, need_barg = 3 };
    int behavior[ max_op_grp ];
    #define OPERATOR( S, N, G ) behavior[ G ] = N;
    #include "Operators.h"
    #undef OPERATOR

    for( int num_grp = max_op_grp - 1; num_grp >= 0; --num_grp ) {
        for( Lexem *item = sibling[ num_grp ]; item; item = item->sibling ) {
            switch( behavior[ num_grp ] ) {
            case need_none: break;
            case need_larg: assemble_larg( item ); break;
            case need_rarg: assemble_rarg( item ); break;
            case need_barg: assemble_barg( item ); break;
            }
        }
    }

    // assemble machines
    for( Lexem *item = res; item; item = item->next ) {
        if ( item->eq( Lexem::OPERATOR, "=" ) ) {
            for( Lexem *next = item->next; ; next = next->next ) {
                if ( not next or next->eq( Lexem::OPERATOR, "=" ) or next->type == Lexem::TEST or next->type == Lexem::TRAINING or next->type == Lexem::METHODS or next->type == Lexem::FLAGS ) {
                    if ( next != item->next ) {
                        item->children[ 1 ] = item->next;
                        item->next->parent = item;
                        item->next->prev = 0;
                        if ( next ) {
                            next->prev->next = 0;
                            next->prev = item;
                        }
                        item->next = next;
                    }
                    break;
                }
            }
        }
    }

    return res->next;
}